

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O3

void __thiscall
pzgeom::TPZArc3D::TPZArc3D
          (TPZArc3D *this,TPZArc3D *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap)

{
  double *pdVar1;
  REAL RVar2;
  
  TPZNodeRep<3,_pztopology::TPZLine>::TPZNodeRep
            (&this->super_TPZNodeRep<3,_pztopology::TPZLine>,&PTR_PTR_018ac768,
             &cp->super_TPZNodeRep<3,_pztopology::TPZLine>,gl2lcNdMap);
  (this->super_TPZNodeRep<3,_pztopology::TPZLine>).super_TPZLine.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZArc3D_018ac710;
  pdVar1 = (this->fICnBase).fBuf;
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive
       = '\0';
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01816238;
  (this->fICnBase).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fICnBase).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fICnBase).super_TPZFMatrix<double>.fSize = 9;
  TPZVec<int>::TPZVec(&(this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fICnBase).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fICnBase).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fICnBase).super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0
  ;
  (this->fICnBase).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fICnBase).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fICnBase).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fICnBase).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fICnBase).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01815f48;
  pdVar1 = (this->fIBaseCn).fBuf;
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive
       = '\0';
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01816238;
  (this->fIBaseCn).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fIBaseCn).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fIBaseCn).super_TPZFMatrix<double>.fSize = 9;
  TPZVec<int>::TPZVec(&(this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0
  ;
  (this->fIBaseCn).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fIBaseCn).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fIBaseCn).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZManVector<double,_3>::TPZManVector(&this->fCenter3D,0);
  TPZManVector<double,_3>::TPZManVector(&this->finitialVector,0);
  TPZFMatrix<double>::operator=
            (&(this->fICnBase).super_TPZFMatrix<double>,&(cp->fICnBase).super_TPZFMatrix<double>);
  TPZFMatrix<double>::operator=
            (&(this->fIBaseCn).super_TPZFMatrix<double>,&(cp->fIBaseCn).super_TPZFMatrix<double>);
  TPZManVector<double,_3>::operator=(&this->fCenter3D,&cp->fCenter3D);
  TPZManVector<double,_3>::operator=(&this->finitialVector,&cp->finitialVector);
  RVar2 = cp->fRadius;
  this->fAngle = cp->fAngle;
  this->fRadius = RVar2;
  RVar2 = cp->fYcenter;
  this->fXcenter = cp->fXcenter;
  this->fYcenter = RVar2;
  return;
}

Assistant:

TPZArc3D(const TPZArc3D &cp,std::map<int64_t,int64_t> & gl2lcNdMap) : 
            TPZRegisterClassId(&TPZArc3D::ClassId),
            pzgeom::TPZNodeRep<NNodes,pztopology::TPZLine>(cp,gl2lcNdMap){
			this->fICnBase = cp.fICnBase;
			this->fIBaseCn = cp.fIBaseCn;
			this->fCenter3D = cp.fCenter3D;
                this->finitialVector = cp.finitialVector;
                
			this->fRadius = cp.fRadius;
                this->fAngle = cp.fAngle;
                this->fXcenter = cp.fXcenter;
                this->fYcenter = cp.fYcenter;
		}